

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfdcore_wally_util.cpp
# Opt level: O1

ByteData *
cfd::core::WallyUtil::MulTweakPubkey
          (ByteData *__return_storage_ptr__,ByteData *pubkey,ByteData256 *tweak)

{
  secp256k1_context_struct *context;
  Secp256k1 secp256k1;
  Secp256k1 SStack_58;
  ByteData local_50;
  vector<unsigned_char,_std::allocator<unsigned_char>_> local_38;
  
  context = wally_get_secp_context();
  Secp256k1::Secp256k1(&SStack_58,context);
  ByteData256::GetBytes(&local_38,tweak);
  ByteData::ByteData(&local_50,&local_38);
  Secp256k1::MulTweakPubkeySecp256k1Ec(__return_storage_ptr__,&SStack_58,pubkey,&local_50);
  if (local_50.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_50.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                    ._M_impl.super__Vector_impl_data._M_start);
  }
  if (local_38.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_38.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                    _M_impl.super__Vector_impl_data._M_start);
  }
  return __return_storage_ptr__;
}

Assistant:

ByteData WallyUtil::MulTweakPubkey(
    const ByteData& pubkey, const ByteData256& tweak) {
  struct secp256k1_context_struct* context = wally_get_secp_context();
  Secp256k1 secp256k1(context);
  return secp256k1.MulTweakPubkeySecp256k1Ec(
      pubkey, ByteData(tweak.GetBytes()));
}